

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  path *this;
  undefined8 uVar1;
  undefined4 uVar2;
  SmallVectorImpl<char> *this_00;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  StringRef *__ptr;
  Style in_R8D;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  StringRef SVar11;
  StringRef path_00;
  StringRef path_01;
  StringRef C;
  StringRef C_1;
  SmallString<256U> result;
  SmallVector<llvm::StringRef,_16U> components;
  StringRef local_2e0;
  SmallVectorImpl<char> *local_2d0;
  Child local_2c8;
  size_t sStack_2c0;
  Twine local_2b0;
  StringRef local_298;
  const_iterator local_280 [5];
  Twine local_170;
  Twine local_158;
  SmallVectorTemplateBase<llvm::StringRef,_true> local_140;
  undefined1 local_130 [256];
  
  pcVar7 = (char *)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar1 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar2 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  SVar11.Length._0_4_ = uVar2;
  SVar11.Data = (char *)uVar1;
  uVar9 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       local_130;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity =
       0x10;
  SVar11.Length._4_4_ = 0;
  local_2e0.Data = pcVar7;
  local_2e0.Length = uVar9;
  local_2d0 = path;
  SVar11 = root_path(SVar11,style);
  uVar6 = SVar11.Length;
  if (uVar9 <= SVar11.Length) {
    uVar6 = uVar9;
  }
  this = (path *)(pcVar7 + uVar6);
  sVar8 = uVar9 - uVar6;
  path_01.Length._0_4_ = style;
  path_01.Data = (char *)sVar8;
  path_01.Length._4_4_ = 0;
  begin(local_280,this,path_01,in_R8D);
  if (((path *)local_280[0].Path.Data != this) || (local_280[0].Position != sVar8)) {
    do {
      local_2c8.cString = local_280[0].Component.Data;
      sStack_2c0 = local_280[0].Component.Length;
      if (local_280[0].Component.Length == 1) {
        if (*local_280[0].Component.Data == '.') goto LAB_0017a009;
LAB_00179ff9:
        SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                  (&local_140,(StringRef *)&local_2c8);
      }
      else {
        if ((local_280[0].Component.Length != 2 || !remove_dot_dot) ||
           (*(short *)local_280[0].Component.Data != 0x2e2e)) goto LAB_00179ff9;
        uVar6 = local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                super_SmallVectorBase._8_8_ & 0xffffffff;
        if ((uVar6 == 0) ||
           ((*(long *)((long)local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + uVar6 * 0x10 + -8) == 2 &&
            (**(short **)
               ((long)local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                      super_SmallVectorBase.BeginX + uVar6 * 0x10 + -0x10) == 0x2e2e)))) {
          Twine::Twine(&local_2b0,&local_2e0);
          bVar4 = is_absolute(&local_2b0,style);
          if (!bVar4) goto LAB_00179ff9;
        }
        else {
          if ((ulong)local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                     super_SmallVectorBase.Capacity < uVar6 - 1) {
            __assert_fail("Size <= capacity()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
          }
          local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
          Size = (int)(uVar6 - 1);
        }
      }
LAB_0017a009:
      const_iterator::operator++(local_280);
    } while (((path *)local_280[0].Path.Data != this) ||
            (pcVar7 = local_2e0.Data, uVar9 = local_2e0.Length, local_280[0].Position != sVar8));
  }
  path_00.Length = uVar9;
  path_00.Data = pcVar7;
  SVar11 = root_path(path_00,style);
  local_280[0].Path.Data = (char *)&local_280[0].Component;
  local_280[0].Path.Length = 0x10000000000;
  SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)local_280,SVar11.Data,SVar11.Data + SVar11.Length);
  pvVar3 = local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
           BeginX;
  uVar6 = local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
          _8_8_ & 0xffffffff;
  if (uVar6 != 0) {
    lVar10 = 0;
    do {
      local_298.Data = *(char **)((long)pvVar3 + lVar10);
      local_298.Length = ((undefined8 *)((long)pvVar3 + lVar10))[1];
      Twine::Twine(&local_2b0,&local_298);
      Twine::Twine((Twine *)&local_2c8,"");
      Twine::Twine(&local_158,"");
      Twine::Twine(&local_170,"");
      append((SmallVectorImpl<char> *)local_280,style,&local_2b0,(Twine *)&local_2c8,&local_158,
             &local_170);
      lVar10 = lVar10 + 0x10;
    } while (uVar6 << 4 != lVar10);
  }
  this_00 = local_2d0;
  if ((undefined1 *)
      local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
      != local_130) {
    free(local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
         BeginX);
  }
  __ptr = (StringRef *)local_280[0].Path.Data;
  if (((uint)local_280[0].Path.Length ==
       (this_00->super_SmallVectorTemplateBase<char,_true>).
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) &&
     (((local_280[0].Path.Length & 0xffffffff) == 0 ||
      (iVar5 = bcmp(local_280[0].Path.Data,
                    (this_00->super_SmallVectorTemplateBase<char,_true>).
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                    local_280[0].Path.Length & 0xffffffff), iVar5 == 0)))) {
    bVar4 = false;
  }
  else {
    SmallVectorImpl<char>::swap(this_00,(SmallVectorImpl<char> *)local_280);
    bVar4 = true;
    __ptr = (StringRef *)local_280[0].Path.Data;
  }
  if (__ptr != &local_280[0].Component) {
    free(__ptr);
  }
  return bVar4;
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}